

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anti_exfil.c
# Opt level: O0

int wally_ae_signer_commit_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uchar *commitment,
              size_t commitment_len,uint32_t flags,uchar *s2c_opening_out,size_t s2c_opening_out_len
              )

{
  int iVar1;
  secp256k1_context *ctx_00;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_s2c_opening opening_secp;
  size_t commitment_len_local;
  uchar *commitment_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  opening_secp.data._56_8_ = commitment_len;
  ctx_00 = secp_ctx();
  if ((((((priv_key == (uchar *)0x0) || (priv_key_len != 0x20)) || (bytes == (uchar *)0x0)) ||
       ((bytes_len != 0x20 || (commitment == (uchar *)0x0)))) ||
      ((opening_secp.data._56_8_ != 0x20 || ((flags != 1 || (s2c_opening_out == (uchar *)0x0))))))
     || (s2c_opening_out_len != 0x21)) {
    priv_key_local._4_4_ = -2;
  }
  else if (ctx_00 == (secp256k1_context *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else {
    iVar1 = secp256k1_ecdsa_anti_exfil_signer_commit
                      (ctx_00,(secp256k1_ecdsa_s2c_opening *)&ctx,bytes,priv_key,commitment);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ecdsa_s2c_opening_serialize
                        (ctx_00,s2c_opening_out,(secp256k1_ecdsa_s2c_opening *)&ctx);
      bVar2 = iVar1 != 0;
    }
    wally_clear(&ctx,0x40);
    priv_key_local._4_4_ = -2;
    if (bVar2) {
      priv_key_local._4_4_ = 0;
    }
  }
  return priv_key_local._4_4_;
}

Assistant:

WALLY_CORE_API int wally_ae_signer_commit_from_bytes(
    const unsigned char *priv_key,
    size_t priv_key_len,
    const unsigned char *bytes,
    size_t bytes_len,
    const unsigned char *commitment,
    size_t commitment_len,
    uint32_t flags,
    unsigned char *s2c_opening_out,
    size_t s2c_opening_out_len)
{
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !commitment || commitment_len != WALLY_HOST_COMMITMENT_LEN ||
        flags != EC_FLAG_ECDSA ||
        !s2c_opening_out || s2c_opening_out_len != WALLY_S2C_OPENING_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = secp256k1_ecdsa_anti_exfil_signer_commit(ctx, &opening_secp, bytes, priv_key, commitment) &&
         secp256k1_ecdsa_s2c_opening_serialize(ctx, s2c_opening_out, &opening_secp);

    wally_clear(&opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}